

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::EvictExtraOutboundPeers
          (PeerManagerImpl *this,seconds now)

{
  strong_ordering sVar1;
  bool bVar2;
  int iVar3;
  long in_RDI;
  long in_FS_OFFSET;
  bool disconnected;
  NodeId to_disconnect;
  int64_t oldest_block_announcement;
  NodeId worst_peer;
  pair<long,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> next_youngest_peer;
  pair<long,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> youngest_peer;
  function<bool_(CNode_*)> *in_stack_fffffffffffffe38;
  anon_class_16_2_633b9a03 *in_stack_fffffffffffffe40;
  function<bool_(CNode_*)> *in_stack_fffffffffffffe48;
  anon_class_24_3_1f72c320 *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  CConnman *this_00;
  CConnman *in_stack_fffffffffffffe70;
  CConnman *in_stack_fffffffffffffe78;
  _Any_data *in_stack_fffffffffffffe88;
  CConnman **in_stack_fffffffffffffe90;
  CConnman *in_stack_fffffffffffffe98;
  CConnman *local_148;
  anon_class_24_3_d3b66c36 local_110;
  long *local_e8;
  long *local_e0;
  long local_b8;
  long local_b0 [2];
  undefined1 *local_a0;
  _Any_data *local_70;
  CConnman **local_68;
  undefined4 local_40;
  undefined4 local_3c;
  CConnman *local_38 [2];
  undefined4 local_28;
  undefined4 local_24;
  _Any_data local_20;
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = CConnman::GetExtraBlockRelayCount(in_stack_fffffffffffffe70);
  if (0 < iVar3) {
    local_24 = 0xffffffff;
    local_28 = 0;
    in_stack_fffffffffffffe88 = &local_20;
    std::pair<long,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::pair<int,_int,_false>
              ((pair<long,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               in_stack_fffffffffffffe48,(int *)in_stack_fffffffffffffe40,
               (int *)in_stack_fffffffffffffe38);
    local_3c = 0xffffffff;
    local_40 = 0;
    in_stack_fffffffffffffe90 = local_38;
    std::pair<long,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::pair<int,_int,_false>
              ((pair<long,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               in_stack_fffffffffffffe48,(int *)in_stack_fffffffffffffe40,
               (int *)in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe98 = *(CConnman **)(in_RDI + 0x100);
    local_70 = in_stack_fffffffffffffe88;
    local_68 = in_stack_fffffffffffffe90;
    std::function<void(CNode*)>::
    function<(anonymous_namespace)::PeerManagerImpl::EvictExtraOutboundPeers(std::chrono::duration<long,std::ratio<1l,1l>>)::__0,void>
              ((function<void_(CNode_*)> *)in_stack_fffffffffffffe48,
               (anon_class_16_2_41355d8b *)in_stack_fffffffffffffe40);
    CConnman::ForEachNode(in_stack_fffffffffffffe78,(NodeFn *)in_stack_fffffffffffffe70);
    std::function<void_(CNode_*)>::~function((function<void_(CNode_*)> *)in_stack_fffffffffffffe38);
    local_148 = (CConnman *)local_20._M_unused._0_8_;
    sVar1 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<1L,_1L>_>
                      ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe50,
                       (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe48);
    std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_fffffffffffffe38,(__unspec *)0x2c1bef);
    bVar2 = std::operator>(sVar1._M_value);
    if (bVar2) {
      local_148 = local_38[0];
    }
    in_stack_fffffffffffffe70 = *(CConnman **)(in_RDI + 0x100);
    local_a0 = local_10;
    std::function<bool(CNode*)>::
    function<(anonymous_namespace)::PeerManagerImpl::EvictExtraOutboundPeers(std::chrono::duration<long,std::ratio<1l,1l>>)::__1,void>
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    CConnman::ForNode(in_stack_fffffffffffffe98,(NodeId)in_stack_fffffffffffffe90,
                      (function<bool_(CNode_*)> *)in_stack_fffffffffffffe88);
    std::function<bool_(CNode_*)>::~function(in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe78 = local_148;
  }
  iVar3 = CConnman::GetExtraFullOutboundCount(in_stack_fffffffffffffe70);
  if (0 < iVar3) {
    local_b0[0] = -1;
    local_b8 = std::numeric_limits<long>::max();
    this_00 = *(CConnman **)(in_RDI + 0x100);
    local_e8 = &local_b8;
    local_e0 = local_b0;
    std::function<void(CNode*)>::
    function<(anonymous_namespace)::PeerManagerImpl::EvictExtraOutboundPeers(std::chrono::duration<long,std::ratio<1l,1l>>)::__2,void>
              ((function<void_(CNode_*)> *)
               CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe50);
    CConnman::ForEachNode(in_stack_fffffffffffffe78,(NodeFn *)in_stack_fffffffffffffe70);
    std::function<void_(CNode_*)>::~function((function<void_(CNode_*)> *)in_stack_fffffffffffffe38);
    if (local_b0[0] != -1) {
      std::function<bool(CNode*)>::
      function<(anonymous_namespace)::PeerManagerImpl::EvictExtraOutboundPeers(std::chrono::duration<long,std::ratio<1l,1l>>)::__3,void>
                ((function<bool_(CNode_*)> *)
                 CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),&local_110);
      bVar2 = CConnman::ForNode(in_stack_fffffffffffffe98,(NodeId)in_stack_fffffffffffffe90,
                                (function<bool_(CNode_*)> *)in_stack_fffffffffffffe88);
      std::function<bool_(CNode_*)>::~function(in_stack_fffffffffffffe38);
      if ((bVar2 & 1U) != 0) {
        CConnman::SetTryNewOutboundPeer(this_00,bVar2);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::EvictExtraOutboundPeers(std::chrono::seconds now)
{
    // If we have any extra block-relay-only peers, disconnect the youngest unless
    // it's given us a block -- in which case, compare with the second-youngest, and
    // out of those two, disconnect the peer who least recently gave us a block.
    // The youngest block-relay-only peer would be the extra peer we connected
    // to temporarily in order to sync our tip; see net.cpp.
    // Note that we use higher nodeid as a measure for most recent connection.
    if (m_connman.GetExtraBlockRelayCount() > 0) {
        std::pair<NodeId, std::chrono::seconds> youngest_peer{-1, 0}, next_youngest_peer{-1, 0};

        m_connman.ForEachNode([&](CNode* pnode) {
            if (!pnode->IsBlockOnlyConn() || pnode->fDisconnect) return;
            if (pnode->GetId() > youngest_peer.first) {
                next_youngest_peer = youngest_peer;
                youngest_peer.first = pnode->GetId();
                youngest_peer.second = pnode->m_last_block_time;
            }
        });
        NodeId to_disconnect = youngest_peer.first;
        if (youngest_peer.second > next_youngest_peer.second) {
            // Our newest block-relay-only peer gave us a block more recently;
            // disconnect our second youngest.
            to_disconnect = next_youngest_peer.first;
        }
        m_connman.ForNode(to_disconnect, [&](CNode* pnode) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
            AssertLockHeld(::cs_main);
            // Make sure we're not getting a block right now, and that
            // we've been connected long enough for this eviction to happen
            // at all.
            // Note that we only request blocks from a peer if we learn of a
            // valid headers chain with at least as much work as our tip.
            CNodeState *node_state = State(pnode->GetId());
            if (node_state == nullptr ||
                (now - pnode->m_connected >= MINIMUM_CONNECT_TIME && node_state->vBlocksInFlight.empty())) {
                pnode->fDisconnect = true;
                LogDebug(BCLog::NET, "disconnecting extra block-relay-only peer=%d (last block received at time %d)\n",
                         pnode->GetId(), count_seconds(pnode->m_last_block_time));
                return true;
            } else {
                LogDebug(BCLog::NET, "keeping block-relay-only peer=%d chosen for eviction (connect time: %d, blocks_in_flight: %d)\n",
                         pnode->GetId(), count_seconds(pnode->m_connected), node_state->vBlocksInFlight.size());
            }
            return false;
        });
    }

    // Check whether we have too many outbound-full-relay peers
    if (m_connman.GetExtraFullOutboundCount() > 0) {
        // If we have more outbound-full-relay peers than we target, disconnect one.
        // Pick the outbound-full-relay peer that least recently announced
        // us a new block, with ties broken by choosing the more recent
        // connection (higher node id)
        // Protect peers from eviction if we don't have another connection
        // to their network, counting both outbound-full-relay and manual peers.
        NodeId worst_peer = -1;
        int64_t oldest_block_announcement = std::numeric_limits<int64_t>::max();

        m_connman.ForEachNode([&](CNode* pnode) EXCLUSIVE_LOCKS_REQUIRED(::cs_main, m_connman.GetNodesMutex()) {
            AssertLockHeld(::cs_main);

            // Only consider outbound-full-relay peers that are not already
            // marked for disconnection
            if (!pnode->IsFullOutboundConn() || pnode->fDisconnect) return;
            CNodeState *state = State(pnode->GetId());
            if (state == nullptr) return; // shouldn't be possible, but just in case
            // Don't evict our protected peers
            if (state->m_chain_sync.m_protect) return;
            // If this is the only connection on a particular network that is
            // OUTBOUND_FULL_RELAY or MANUAL, protect it.
            if (!m_connman.MultipleManualOrFullOutboundConns(pnode->addr.GetNetwork())) return;
            if (state->m_last_block_announcement < oldest_block_announcement || (state->m_last_block_announcement == oldest_block_announcement && pnode->GetId() > worst_peer)) {
                worst_peer = pnode->GetId();
                oldest_block_announcement = state->m_last_block_announcement;
            }
        });
        if (worst_peer != -1) {
            bool disconnected = m_connman.ForNode(worst_peer, [&](CNode* pnode) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
                AssertLockHeld(::cs_main);

                // Only disconnect a peer that has been connected to us for
                // some reasonable fraction of our check-frequency, to give
                // it time for new information to have arrived.
                // Also don't disconnect any peer we're trying to download a
                // block from.
                CNodeState &state = *State(pnode->GetId());
                if (now - pnode->m_connected > MINIMUM_CONNECT_TIME && state.vBlocksInFlight.empty()) {
                    LogDebug(BCLog::NET, "disconnecting extra outbound peer=%d (last block announcement received at time %d)\n", pnode->GetId(), oldest_block_announcement);
                    pnode->fDisconnect = true;
                    return true;
                } else {
                    LogDebug(BCLog::NET, "keeping outbound peer=%d chosen for eviction (connect time: %d, blocks_in_flight: %d)\n",
                             pnode->GetId(), count_seconds(pnode->m_connected), state.vBlocksInFlight.size());
                    return false;
                }
            });
            if (disconnected) {
                // If we disconnected an extra peer, that means we successfully
                // connected to at least one peer after the last time we
                // detected a stale tip. Don't try any more extra peers until
                // we next detect a stale tip, to limit the load we put on the
                // network from these extra connections.
                m_connman.SetTryNewOutboundPeer(false);
            }
        }
    }
}